

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_impl.c
# Opt level: O0

int log_impl_write(log_impl impl,log_record_ctor record_ctor)

{
  int iVar1;
  log_aspect aspect;
  undefined8 *puVar2;
  undefined8 in_RSI;
  log_impl in_RDI;
  int result;
  log_aspect_stream_impl stream_impl;
  log_aspect stream;
  uint local_4;
  
  aspect = log_impl_aspect(in_RDI,LOG_ASPECT_STREAM);
  puVar2 = (undefined8 *)log_aspect_derived(aspect);
  iVar1 = (*(code *)*puVar2)(aspect,in_RSI);
  local_4 = (uint)(iVar1 != 0);
  return local_4;
}

Assistant:

int log_impl_write(log_impl impl, const log_record_ctor record_ctor)
{
	log_aspect stream = log_impl_aspect(impl, LOG_ASPECT_STREAM);

	log_aspect_stream_impl stream_impl = log_aspect_derived(stream);

	int result = stream_impl->write(stream, record_ctor);

#if defined(__ADDRESS_SANITIZER__) || defined(__THREAD_SANITIZER__) || defined(__MEMORY_SANITIZER__)
	if (record_ctor->level >= LOG_LEVEL_WARNING /* TODO: Also check if stream is stdout */)
	{
		__sanitizer_print_stack_trace();
	}
#endif

	if (result != 0)
	{
		return 1;
	}

	return 0;
}